

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O1

void ncnn::conv3x3s1_winograd43_transform_kernel(Mat *kernel,Mat *AT,int inch,int outch,Option *opt)

{
  void *pvVar1;
  uint uVar2;
  int *piVar3;
  undefined1 auVar4 [12];
  float *pfVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int TILE_K;
  int TILE_M;
  Mat m;
  int TILE_N;
  uint local_160;
  uint local_15c;
  uint local_158;
  int local_154;
  uint local_150;
  uint local_14c;
  Mat local_148;
  undefined1 local_f8 [48];
  int iStack_c8;
  undefined4 uStack_c4;
  int local_c0;
  size_t local_b8;
  float fStack_b0;
  uint uStack_ac;
  undefined1 local_a8 [40];
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  undefined1 auStack_6c [16];
  ulong local_58;
  ulong local_50;
  Mat *local_48;
  Mat *local_40;
  int local_34;
  
  local_48 = kernel;
  get_optimal_tile_mnk(outch,0,inch,(int *)&local_15c,&local_34,(int *)&local_160,opt->num_threads);
  uVar2 = local_160;
  uVar8 = (int)(outch + local_15c + -1) / (int)local_15c;
  iVar7 = local_15c * local_160;
  local_148.cstep = 0;
  local_148.data = (void *)0x0;
  local_148.refcount._0_4_ = 0;
  local_148.refcount._4_4_ = 0;
  local_148.elemsize = 0;
  local_148.elempack = 0;
  local_148.allocator = (Allocator *)0x0;
  local_148.dims = 0;
  local_148.w = 0;
  local_148.h = 0;
  local_148.d = 0;
  local_148.c = 0;
  local_58 = (ulong)(uint)outch;
  Mat::create(&local_148,iVar7 * 0x24,1,opt->num_threads,4,(Allocator *)0x0);
  local_40 = AT;
  Mat::create(AT,iVar7,0x24,(int)(uVar2 + inch + -1) / (int)uVar2,uVar8,4,(Allocator *)0x0);
  if (0 < (int)uVar8) {
    local_154 = inch * 9;
    uVar11 = 0;
    local_158 = uVar8;
    do {
      iVar9 = local_15c * (int)uVar11;
      local_50 = uVar11;
      iVar7 = get_omp_thread_num();
      local_f8._0_8_ = (long)iVar7 * local_148.cstep * local_148.elemsize + (long)local_148.data;
      local_f8._8_4_ = 0;
      local_f8._12_4_ = 0;
      local_f8._16_8_ = local_148.elemsize;
      local_f8._24_4_ = local_148.elempack;
      local_f8._32_8_ = local_148.allocator;
      auVar4._4_4_ = iStack_c8;
      auVar4._8_4_ = uStack_c4;
      auVar4._0_4_ = local_148.w;
      local_f8._40_8_ = auVar4._0_8_ << 0x20;
      iStack_c8 = local_148.h;
      uStack_c4 = 1;
      local_c0 = local_148.d;
      local_f8._40_4_ = local_148.dims + -1;
      local_b8 = (local_148.elemsize * (long)local_148.h * (long)local_148.w + 0xf &
                 0xfffffffffffffff0) / local_148.elemsize;
      if (local_148.dims == 4) {
        local_b8 = (long)local_148.h * (long)local_148.w;
      }
      if (0 < inch) {
        local_150 = (int)local_58 - iVar9;
        iVar7 = 0;
        do {
          uVar2 = local_150;
          if ((int)local_15c < (int)local_150) {
            uVar2 = local_15c;
          }
          local_14c = local_160;
          uVar8 = inch - iVar7;
          if ((int)local_160 < inch - iVar7) {
            uVar8 = local_160;
          }
          if (0 < (int)uVar2) {
            lVar6 = (long)iVar7;
            auVar17 = vpmovsxbq_avx2(ZEXT416(0x24180c00));
            pvVar1 = local_48->data;
            auVar18._8_8_ = pvVar1;
            auVar18._0_8_ = pvVar1;
            auVar18._16_8_ = pvVar1;
            auVar18._24_8_ = pvVar1;
            auVar17 = vpaddq_avx512vl(auVar17,auVar18);
            uVar11 = 0;
            pfVar5 = (float *)local_f8._0_8_;
            do {
              if (0 < (int)uVar8) {
                auVar18 = vpbroadcastq_avx512vl();
                auVar18 = vpsllq_avx2(auVar18,2);
                auVar18 = vpaddq_avx2(auVar17,auVar18);
                uVar12 = 0;
                do {
                  auVar19 = vpbroadcastq_avx512vl();
                  vpaddq_avx2(auVar18,auVar19);
                  auVar13 = vgatherqps_avx512vl(*(undefined8 *)
                                                 ((uVar12 + lVar6) * 0x24 + (ulong)uVar2));
                  auVar14 = vgatherqps_avx512vl(*(undefined8 *)(lVar6 + 4));
                  auVar15 = vgatherqps_avx512vl(*(undefined8 *)(lVar6 + 8));
                  local_a8._0_8_ = auVar13._0_8_;
                  auVar20._0_4_ = auVar13._0_4_ * -0.6666667;
                  auVar20._4_4_ = auVar13._4_4_ * -0.6666667;
                  auVar20._8_4_ = auVar13._8_4_ * -0.6666667;
                  auVar20._12_4_ = auVar13._12_4_ * -0.6666667;
                  fVar23 = auVar14._0_4_ * 0.47140452;
                  fVar24 = auVar14._4_4_ * 0.47140452;
                  fVar25 = auVar14._8_4_ * 0.47140452;
                  fVar26 = auVar14._12_4_ * 0.47140452;
                  auVar27._0_4_ = auVar15._0_4_ * 0.33333334;
                  auVar27._4_4_ = auVar15._4_4_ * 0.33333334;
                  auVar27._8_4_ = auVar15._8_4_ * 0.33333334;
                  auVar27._12_4_ = auVar15._12_4_ * 0.33333334;
                  auVar28._0_4_ = fVar23 + auVar27._0_4_;
                  auVar28._4_4_ = fVar24 + auVar27._4_4_;
                  auVar28._8_4_ = fVar25 + auVar27._8_4_;
                  auVar28._12_4_ = fVar26 + auVar27._12_4_;
                  auVar16 = vsubps_avx(auVar20,auVar28);
                  local_a8._12_4_ = auVar16._0_4_;
                  local_a8._16_8_ = auVar16._4_8_;
                  auVar21._0_4_ = fVar23 + auVar20._0_4_;
                  auVar21._4_4_ = fVar24 + auVar20._4_4_;
                  auVar21._8_4_ = fVar25 + auVar20._8_4_;
                  auVar21._12_4_ = fVar26 + auVar20._12_4_;
                  auVar16 = vsubps_avx(auVar21,auVar27);
                  local_a8._24_4_ = auVar16._0_4_;
                  local_a8._28_4_ = auVar16._4_4_;
                  local_a8._32_4_ = auVar16._8_4_;
                  auVar22._0_4_ = auVar13._0_4_ * 0.16666667;
                  auVar22._4_4_ = auVar13._4_4_ * 0.16666667;
                  auVar22._8_4_ = auVar13._8_4_ * 0.16666667;
                  auVar22._12_4_ = auVar13._12_4_ * 0.16666667;
                  auVar13._0_4_ = auVar14._0_4_ * 0.23570226;
                  auVar13._4_4_ = auVar14._4_4_ * 0.23570226;
                  auVar13._8_4_ = auVar14._8_4_ * 0.23570226;
                  auVar13._12_4_ = auVar14._12_4_ * 0.23570226;
                  local_a8._36_4_ = auVar13._0_4_ + auVar22._0_4_ + auVar27._0_4_;
                  local_80 = auVar13._4_4_ + auVar22._4_4_ + auVar27._4_4_;
                  fStack_7c = auVar13._8_4_ + auVar22._8_4_ + auVar27._8_4_;
                  auVar16 = vsubps_avx(auVar22,auVar13);
                  fStack_78 = auVar16._0_4_ + auVar27._0_4_;
                  fStack_74 = auVar16._4_4_ + auVar27._4_4_;
                  fStack_70 = auVar16._8_4_ + auVar27._8_4_;
                  auVar16._0_12_ = auVar15._0_12_;
                  auVar16._12_4_ = auStack_6c._12_4_;
                  auStack_6c = auVar16;
                  lVar10 = 8;
                  do {
                    fVar23 = *(float *)((long)&fStack_b0 + lVar10);
                    fVar24 = *(float *)(local_a8 + lVar10);
                    auVar16 = vmulss_avx512f(ZEXT416(*(uint *)((long)&uStack_ac + lVar10)),
                                             SUB6416(ZEXT464(0x3ef15bef),0));
                    auVar13 = vmulss_avx512f(ZEXT416((uint)fVar24),SUB6416(ZEXT464(0x3eaaaaab),0));
                    fVar25 = auVar13._0_4_;
                    auVar13 = vmulss_avx512f(ZEXT416((uint)fVar23),SUB6416(ZEXT464(0x3e2aaaab),0));
                    auVar14 = vmulss_avx512f(ZEXT416(*(uint *)((long)&uStack_ac + lVar10)),
                                             SUB6416(ZEXT464(0x3e715bef),0));
                    *pfVar5 = fVar23;
                    pfVar5[1] = fVar23 * -0.6666667 - (auVar16._0_4_ + fVar25);
                    pfVar5[2] = (auVar16._0_4_ + fVar23 * -0.6666667) - fVar25;
                    pfVar5[3] = auVar14._0_4_ + auVar13._0_4_ + fVar25;
                    pfVar5[4] = (auVar13._0_4_ - auVar14._0_4_) + fVar25;
                    pfVar5[5] = fVar24;
                    pfVar5 = pfVar5 + 6;
                    lVar10 = lVar10 + 0xc;
                  } while (lVar10 != 0x50);
                  uVar12 = uVar12 + 1;
                } while (uVar12 != uVar8);
              }
              uVar11 = uVar11 + 1;
            } while (uVar11 != uVar2);
          }
          fStack_7c = (float)local_40->w;
          local_a8._16_8_ = local_40->elemsize;
          fStack_78 = (float)local_40->h;
          local_a8._24_4_ = local_40->elempack;
          local_a8._0_8_ =
               (long)local_40->data +
               local_a8._16_8_ * (long)(int)fStack_78 * (long)(int)fStack_7c *
               (long)(iVar7 / (int)local_160) +
               (long)(iVar9 / (int)local_15c) * local_40->cstep * local_a8._16_8_;
          local_a8._8_4_ = 0;
          local_a8._12_4_ = 0;
          local_a8._32_4_ = SUB84(local_40->allocator,0);
          local_a8._36_4_ = (undefined4)((ulong)local_40->allocator >> 0x20);
          local_80 = 2.8026e-45;
          fStack_74 = 1.4013e-45;
          fStack_70 = 1.4013e-45;
          auStack_6c._4_8_ = (long)(int)fStack_78 * (long)(int)fStack_7c;
          pack_A_tile((Mat *)local_f8,(Mat *)local_a8,0x24,uVar2,uVar8);
          piVar3 = (int *)CONCAT44(local_a8._12_4_,local_a8._8_4_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if ((long *)CONCAT44(local_a8._36_4_,local_a8._32_4_) == (long *)0x0) {
                if ((void *)local_a8._0_8_ != (void *)0x0) {
                  free((void *)local_a8._0_8_);
                }
              }
              else {
                (**(code **)(*(long *)CONCAT44(local_a8._36_4_,local_a8._32_4_) + 0x18))();
              }
            }
          }
          auStack_6c._4_8_ = 0;
          local_a8._0_8_ = (void *)0x0;
          local_a8._8_4_ = 0;
          local_a8._12_4_ = 0;
          local_a8._16_8_ = 0;
          local_a8._24_4_ = 0;
          local_80 = 0.0;
          fStack_7c = 0.0;
          fStack_78 = 0.0;
          fStack_74 = 0.0;
          fStack_70 = 0.0;
          iVar7 = iVar7 + local_160;
        } while (iVar7 < inch);
      }
      uVar2 = local_158;
      piVar3 = (int *)CONCAT44(local_f8._12_4_,local_f8._8_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if ((Allocator *)local_f8._32_8_ == (Allocator *)0x0) {
            if ((float *)local_f8._0_8_ != (float *)0x0) {
              free((void *)local_f8._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_f8._32_8_)[3])();
          }
        }
      }
      local_b8 = 0;
      local_f8._0_8_ = (void *)0x0;
      local_f8._8_4_ = 0;
      local_f8._12_4_ = 0;
      local_f8._16_8_ = 0;
      local_f8._24_4_ = 0;
      stack0xffffffffffffff30 = (undefined1  [16])0x0;
      local_c0 = 0;
      uVar8 = (int)local_50 + 1;
      uVar11 = (ulong)uVar8;
    } while (uVar8 != uVar2);
  }
  piVar3 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_148.allocator == (Allocator *)0x0) {
        if (local_148.data != (void *)0x0) {
          free(local_148.data);
        }
      }
      else {
        (*(local_148.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43_transform_kernel(const Mat& kernel, Mat& AT, int inch, int outch, const Option& opt)
{
    const int M = outch;
    const int K = inch;
    const int B = 36;

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, 0, K, TILE_M, TILE_N, TILE_K, opt.num_threads);

    const int nn_M = (M + TILE_M - 1) / TILE_M;

    Mat A_tileX(B * TILE_M * TILE_K, 1, opt.num_threads, 4u, (Allocator*)0);

    AT.create(TILE_K * TILE_M, B, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 4u, (Allocator*)0);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        Mat A_tile = A_tileX.channel(get_omp_thread_num());

        for (int k = 0; k < K; k += TILE_K)
        {
            const int max_ii = std::min((M - i), TILE_M);
            const int max_kk = std::min((K - k), TILE_K);

            conv3x3s1_winograd43_transform_kernel_tile(kernel, A_tile, inch, i, max_ii, k, max_kk);

            Mat AT_tile = AT.channel(i / TILE_M).depth(k / TILE_K);

            pack_A_tile(A_tile, AT_tile, B, max_ii, max_kk);
        }
    }
}